

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall
Memory::Recycler::AutoSetupRecyclerForNonCollectingMark::~AutoSetupRecyclerForNonCollectingMark
          (AutoSetupRecyclerForNonCollectingMark *this)

{
  code *pcVar1;
  bool bVar2;
  undefined8 *in_FS_OFFSET;
  AutoSetupRecyclerForNonCollectingMark *this_local;
  
  if ((this->m_setupDone & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1f27,"(m_setupDone)","m_setupDone");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if ((this->m_recycler->allowAllocationDuringHeapEnum & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1f28,"(!m_recycler.allowAllocationDuringHeapEnum)",
                       "!m_recycler.allowAllocationDuringHeapEnum");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  memcpy(&this->m_recycler->collectionStats,&this->m_previousCollectionStats,0x538);
  SetCollectionState(this->m_recycler,this->m_previousCollectionState);
  this->m_recycler->isHeapEnumInProgress = false;
  this->m_recycler->isCollectionDisabled = false;
  return;
}

Assistant:

Recycler::AutoSetupRecyclerForNonCollectingMark::~AutoSetupRecyclerForNonCollectingMark()
{
    Assert(m_setupDone);
    Assert(!m_recycler.allowAllocationDuringHeapEnum);
#ifdef RECYCLER_STATS
    m_recycler.collectionStats = m_previousCollectionStats;
#endif
    m_recycler.SetCollectionState(m_previousCollectionState);
    m_recycler.isHeapEnumInProgress = false;
    m_recycler.isCollectionDisabled = false;
}